

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusionKalman4.cpp
# Opt level: O3

void __thiscall
RTFusionKalman4::newIMUData(RTFusionKalman4 *this,RTIMU_DATA *data,RTIMUSettings *settings)

{
  RTVector3 *pRVar1;
  RTQuaternion *this_00;
  undefined8 *puVar2;
  uint64_t uVar3;
  long lVar4;
  char *pcVar5;
  RTVector3 *pRVar6;
  float fVar7;
  RTVector3 local_3c;
  
  if ((this->super_RTFusion).m_enableGyro == true) {
    pRVar6 = &data->gyro;
  }
  else {
    pRVar6 = &local_3c;
    RTVector3::RTVector3(pRVar6);
  }
  RTVector3::operator=(&this->m_gyro,pRVar6);
  pRVar6 = &(this->super_RTFusion).m_accel;
  RTVector3::operator=(pRVar6,&data->accel);
  pRVar1 = &(this->super_RTFusion).m_compass;
  RTVector3::operator=(pRVar1,&data->compass);
  (this->super_RTFusion).m_compassValid = data->compassValid;
  uVar3 = data->timestamp;
  if ((this->super_RTFusion).m_firstTime == true) {
    (this->super_RTFusion).m_lastFusionTime = uVar3;
    RTFusion::calculatePose(&this->super_RTFusion,pRVar6,pRVar1,settings->m_compassAdjDeclination);
    RTMatrix4x4::fill(&this->m_Fk,0.0);
    RTMatrix4x4::fill(&this->m_Pkk,0.0);
    lVar4 = 0;
    do {
      puVar2 = (undefined8 *)((long)(this->m_Pkk).m_data[0] + lVar4);
      *puVar2 = 0x3f0000003f000000;
      puVar2[1] = 0x3f0000003f000000;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    pRVar6 = &(this->super_RTFusion).m_measuredPose;
    RTQuaternion::fromEuler(&this->m_stateQ,pRVar6);
    RTQuaternion::operator=(&(this->super_RTFusion).m_fusionQPose,&this->m_stateQ);
    RTVector3::operator=(&(this->super_RTFusion).m_fusionPose,pRVar6);
    (this->super_RTFusion).m_firstTime = false;
  }
  else {
    fVar7 = (float)(uVar3 - (this->super_RTFusion).m_lastFusionTime) / 1e+06;
    this->m_timeDelta = fVar7;
    (this->super_RTFusion).m_lastFusionTime = uVar3;
    if (fVar7 <= 0.0) {
      return;
    }
    if ((this->super_RTFusion).m_debug == true) {
      puts("\n------");
      fflush(_stdout);
      printf("IMU update delta time: %f\n",SUB84((double)this->m_timeDelta,0));
      fflush(_stdout);
    }
    RTFusion::calculatePose
              (&this->super_RTFusion,&data->accel,&data->compass,settings->m_compassAdjDeclination);
    predict(this);
    update(this);
    this_00 = &this->m_stateQ;
    pRVar6 = &(this->super_RTFusion).m_fusionPose;
    RTQuaternion::toEuler(this_00,pRVar6);
    RTQuaternion::operator=(&(this->super_RTFusion).m_fusionQPose,this_00);
    if ((this->super_RTFusion).m_debug == true) {
      pRVar1 = &(this->super_RTFusion).m_measuredPose;
      pcVar5 = RTMath::displayRadians("Measured pose",pRVar1);
      printf("%s",pcVar5);
      fflush(_stdout);
      pcVar5 = RTMath::displayRadians("Kalman pose",pRVar6);
      printf("%s",pcVar5);
      fflush(_stdout);
      pcVar5 = RTMath::displayRadians("Measured quat",pRVar1);
      printf("%s",pcVar5);
      fflush(_stdout);
      pcVar5 = RTMath::display("Kalman quat",this_00);
      printf("%s",pcVar5);
      fflush(_stdout);
      pcVar5 = RTMath::display("Error quat",&this->m_stateQError);
      printf("%s",pcVar5);
      fflush(_stdout);
    }
  }
  data->fusionPoseValid = true;
  data->fusionQPoseValid = true;
  RTVector3::operator=(&data->fusionPose,&(this->super_RTFusion).m_fusionPose);
  RTQuaternion::operator=(&data->fusionQPose,&(this->super_RTFusion).m_fusionQPose);
  return;
}

Assistant:

void RTFusionKalman4::newIMUData(RTIMU_DATA& data, const RTIMUSettings *settings)
{
    if (m_enableGyro)
        m_gyro = data.gyro;
    else
        m_gyro = RTVector3();
    m_accel = data.accel;
    m_compass = data.compass;
    m_compassValid = data.compassValid;

    if (m_firstTime) {
        m_lastFusionTime = data.timestamp;
        calculatePose(m_accel, m_compass, settings->m_compassAdjDeclination);
        m_Fk.fill(0);

        //  init covariance matrix to something

        m_Pkk.fill(0);
        for (int i = 0; i < 4; i++)
            for (int j = 0; j < 4; j++)
                m_Pkk.setVal(i,j, 0.5);

        // initialize the observation model Hk
        // Note: since the model is the state vector, this is an identity matrix so it won't be used

        //  initialize the poses

        m_stateQ.fromEuler(m_measuredPose);
        m_fusionQPose = m_stateQ;
        m_fusionPose = m_measuredPose;
        m_firstTime = false;
    } else {
        m_timeDelta = (RTFLOAT)(data.timestamp - m_lastFusionTime) / (RTFLOAT)1000000;
        m_lastFusionTime = data.timestamp;
        if (m_timeDelta <= 0)
            return;

        if (m_debug) {
            HAL_INFO("\n------\n");
            HAL_INFO1("IMU update delta time: %f\n", m_timeDelta);
        }

        calculatePose(data.accel, data.compass, settings->m_compassAdjDeclination);

        predict();
        update();
        m_stateQ.toEuler(m_fusionPose);
        m_fusionQPose = m_stateQ;

        if (m_debug) {
            HAL_INFO(RTMath::displayRadians("Measured pose", m_measuredPose));
            HAL_INFO(RTMath::displayRadians("Kalman pose", m_fusionPose));
            HAL_INFO(RTMath::displayRadians("Measured quat", m_measuredPose));
            HAL_INFO(RTMath::display("Kalman quat", m_stateQ));
            HAL_INFO(RTMath::display("Error quat", m_stateQError));
         }
    }
    data.fusionPoseValid = true;
    data.fusionQPoseValid = true;
    data.fusionPose = m_fusionPose;
    data.fusionQPose = m_fusionQPose;
}